

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

void uv__io_poll(uv_loop_t *loop,int timeout)

{
  uv__queue *puVar1;
  long *plVar2;
  uv__iou *ctl;
  uint uVar3;
  int epollfd;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint *puVar7;
  uv__queue *puVar8;
  uv__io_s *puVar9;
  long lVar10;
  uv__statx *statxbuf;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  uv__queue *puVar14;
  int *piVar15;
  uint64_t uVar16;
  long lVar17;
  long lVar18;
  uint __timeout;
  ulong uVar19;
  ulong uVar20;
  epoll_event *e_00;
  uint uVar21;
  bool bVar22;
  bool bVar23;
  epoll_event e;
  uv__invalidate inv;
  sigset_t sigset;
  epoll_event prep [256];
  epoll_event events [1024];
  int local_3d50;
  uint local_3d48;
  int local_3d14;
  epoll_event local_3d08;
  sigset_t *local_3cf8;
  uv__io_s *local_3cf0;
  uint64_t local_3ce8;
  ulong local_3ce0;
  int *local_3cd8;
  epoll_event *local_3cd0;
  epoll_event *local_3cc8;
  uint local_3cc0;
  sigset_t local_3cb8;
  epoll_event local_3c38 [256];
  epoll_event local_3038 [768];
  
  puVar7 = (uint *)loop->internal_fields;
  if ((loop->flags & 1) == 0) {
    local_3cf8 = (sigset_t *)0x0;
  }
  else {
    sigemptyset(&local_3cb8);
    local_3cf8 = &local_3cb8;
    sigaddset(&local_3cb8,0x1b);
  }
  if (timeout < -1) {
    __assert_fail("timeout >= -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                  ,0x510,"void uv__io_poll(uv_loop_t *, int)");
  }
  ctl = (uv__iou *)(puVar7 + 0x32);
  local_3ce8 = loop->time;
  uVar3 = *puVar7;
  bVar22 = (uVar3 & 1) == 0;
  epollfd = loop->backend_fd;
  local_3d08.data.u64._4_4_ = 0;
  __timeout = 0;
  if (bVar22) {
    __timeout = timeout;
  }
  local_3d08._0_8_ = 0;
  puVar1 = &loop->watcher_queue;
  puVar14 = (loop->watcher_queue).next;
  if (puVar14 != puVar1) {
    do {
      puVar8 = puVar14->next;
      puVar14->prev->next = puVar8;
      puVar8->prev = puVar14->prev;
      puVar14->next = puVar14;
      puVar14->prev = puVar14;
      bVar23 = *(int *)((long)&puVar14[1].next + 4) != 0;
      local_3d08.events = *(uint32_t *)&puVar14[1].next;
      *(uint32_t *)((long)&puVar14[1].next + 4) = local_3d08.events;
      local_3d08.data.fd = *(int *)&puVar14[1].prev;
      uv__epoll_ctl_prep(epollfd,ctl,&local_3c38,bVar23 + 1 + (uint)bVar23,*(int *)&puVar14[1].prev,
                         &local_3d08);
      puVar14 = puVar1->next;
    } while (puVar14 != puVar1);
  }
  uVar3 = -(uVar3 & 1) & timeout;
  local_3cc8 = local_3038;
  local_3cd0 = local_3c38;
  local_3cc0 = 0xffffffff;
  local_3cf0 = &loop->signal_io_watcher;
  local_3d14 = 0x30;
  local_3d48 = timeout;
  do {
    while( true ) {
      if ((loop->nfds == 0) && (puVar7[0x73] == 0)) goto LAB_0015d8e3;
      if (puVar7[0x50] != 0xffffffff) {
        while (**(int **)(puVar7 + 0x32) != **(int **)(puVar7 + 0x34)) {
          uv__epoll_ctl_flush(epollfd,ctl,&local_3c38);
        }
      }
      if (__timeout != 0) {
        uv__metrics_set_provider_entry_time(loop);
      }
      puVar7[0x30] = __timeout;
      uVar12 = epoll_pwait(epollfd,local_3038,0x400,__timeout,local_3cf8);
      piVar15 = __errno_location();
      iVar4 = *piVar15;
      uVar16 = uv__hrtime(UV_CLOCK_FAST);
      loop->time = uVar16 / 1000000;
      *piVar15 = iVar4;
      local_3cd8 = piVar15;
      if (uVar12 != 0xffffffff) break;
      if (iVar4 != 4) {
        abort();
      }
      if (!bVar22) {
        __timeout = uVar3;
      }
joined_r0x0015d888:
      bVar22 = true;
      if (__timeout != 0xffffffff) {
        if (__timeout == 0) goto LAB_0015d8e3;
        if ((int)__timeout < 1) {
          __assert_fail("timeout > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                        ,0x5ef,"void uv__io_poll(uv_loop_t *, int)");
        }
        __timeout = local_3d48 + ((int)local_3ce8 - (int)loop->time);
        bVar22 = true;
        local_3d48 = __timeout;
        if ((int)__timeout < 1) goto LAB_0015d8e3;
      }
    }
    if (uVar12 == 0) {
      if (__timeout == 0xffffffff) {
        __assert_fail("timeout != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                      ,0x558,"void uv__io_poll(uv_loop_t *, int)");
      }
      if (!bVar22) {
        __timeout = uVar3;
      }
      goto joined_r0x0015d888;
    }
    *(epoll_event ***)(puVar7 + 0x76) = &local_3cd0;
    local_3cc0 = uVar12;
    if ((int)uVar12 < 1) {
      bVar11 = false;
      local_3d50 = 0;
      bVar23 = false;
    }
    else {
      local_3ce0 = (ulong)uVar12;
      uVar19 = 0;
      bVar23 = false;
      local_3d50 = 0;
      bVar11 = false;
      do {
        uVar21 = *(uint *)(&local_3038[0].field_0x4 + uVar19 * 0xc);
        if ((ulong)uVar21 != 0xffffffff) {
          if (uVar21 == puVar7[0x72]) {
            uVar21 = **(uint **)(puVar7 + 0x5e);
            uVar5 = **(uint **)(puVar7 + 0x60);
            uVar13 = uVar5 - uVar21;
            if (uVar13 == 0) {
              uVar20 = 0;
            }
            else {
              uVar6 = puVar7[0x62];
              lVar18 = *(long *)(puVar7 + 0x66);
              do {
                lVar17 = (ulong)(uVar21 & uVar6) * 0x10;
                lVar10 = *(long *)(lVar18 + lVar17);
                if (*(int *)(lVar10 + 8) != 6) {
                  __assert_fail("req->type == UV_FS",
                                "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                                ,0x441,"void uv__poll_io_uring(uv_loop_t *, struct uv__iou *)");
                }
                if ((loop->active_reqs).count == 0) {
                  __assert_fail("uv__has_active_reqs(loop)",
                                "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                                ,0x443,"void uv__poll_io_uring(uv_loop_t *, struct uv__iou *)");
                }
                (loop->active_reqs).count = (loop->active_reqs).count - 1;
                puVar7[0x73] = puVar7[0x73] - 1;
                iVar4 = *(int *)(lVar17 + lVar18 + 8);
                *(long *)(lVar10 + 0x58) = (long)iVar4;
                if (*(int *)(lVar10 + 0x40) - 6U < 3) {
                  statxbuf = *(uv__statx **)(lVar10 + 0x60);
                  *(undefined8 *)(lVar10 + 0x60) = 0;
                  if (iVar4 == 0) {
                    uv__statx_to_stat(statxbuf,(uv_stat_t *)(lVar10 + 0x70));
                    *(uv_stat_t **)(lVar10 + 0x60) = (uv_stat_t *)(lVar10 + 0x70);
                  }
                  uv__free(statxbuf);
                }
                uv__metrics_update_idle_time(loop);
                (**(code **)(lVar10 + 0x50))(lVar10);
                uVar21 = uVar21 + 1;
              } while (uVar5 != uVar21);
              uVar20 = (ulong)uVar13;
            }
            **(uint **)(puVar7 + 0x5e) = uVar5;
            if ((**(uint **)(puVar7 + 0x5c) & 2) != 0) {
              do {
                lVar18 = syscall(0x1aa,(ulong)puVar7[0x72],0,0,1,0,0);
                if ((int)lVar18 != -1) {
                  if (-1 < (int)lVar18) goto LAB_0015d75f;
                  break;
                }
              } while (*local_3cd8 == 4);
              perror("libuv: io_uring_enter(getevents)");
            }
LAB_0015d75f:
            plVar2 = (long *)((long)loop->internal_fields + 0x10);
            *plVar2 = *plVar2 + uVar20;
            bVar23 = true;
            if (*(int *)((long)loop->internal_fields + 0xc0) == 0) {
              plVar2 = (long *)((long)loop->internal_fields + 0x18);
              *plVar2 = *plVar2 + uVar20;
            }
          }
          else {
            if ((int)uVar21 < 0) {
              __assert_fail("fd >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                            ,0x593,"void uv__io_poll(uv_loop_t *, int)");
            }
            if (loop->nwatchers <= uVar21) {
              __assert_fail("(unsigned) fd < loop->nwatchers",
                            "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                            ,0x594,"void uv__io_poll(uv_loop_t *, int)");
            }
            e_00 = (epoll_event *)(&local_3038[0].events + uVar19 * 3);
            puVar9 = loop->watchers[uVar21];
            if (puVar9 == (uv__io_s *)0x0) {
              uv__epoll_ctl_prep(epollfd,ctl,&local_3c38,2,uVar21,e_00);
            }
            else {
              uVar21 = (puVar9->pevents | 0x18) & e_00->events;
              e_00->events = uVar21;
              if (uVar21 != 0) {
                if ((uVar21 == 0x10) || (uVar21 == 8)) {
                  e_00->events = puVar9->pevents & 0x2007 | uVar21;
                }
                if (puVar9 == local_3cf0) {
                  bVar11 = true;
                }
                else {
                  uv__metrics_update_idle_time(loop);
                  (*puVar9->cb)(loop,puVar9,e_00->events);
                }
                local_3d50 = local_3d50 + 1;
              }
            }
          }
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != local_3ce0);
    }
    plVar2 = (long *)((long)loop->internal_fields + 0x10);
    *plVar2 = *plVar2 + (long)local_3d50;
    if (!bVar22) {
      plVar2 = (long *)((long)loop->internal_fields + 0x18);
      *plVar2 = *plVar2 + (long)local_3d50;
      __timeout = uVar3;
    }
    if (bVar11) {
      uv__metrics_update_idle_time(loop);
      (*(loop->signal_io_watcher).cb)(loop,local_3cf0,1);
    }
    puVar7[0x76] = 0;
    puVar7[0x77] = 0;
    if (bVar23 || bVar11) break;
    if (local_3d50 == 0) goto joined_r0x0015d888;
    if (uVar12 != 0x400) break;
    __timeout = 0;
    bVar22 = true;
    local_3d14 = local_3d14 + -1;
  } while (local_3d14 != 0);
LAB_0015d8e3:
  if ((puVar7[0x50] != 0xffffffff) && (**(int **)(puVar7 + 0x32) != **(int **)(puVar7 + 0x34))) {
    do {
      uv__epoll_ctl_flush(epollfd,ctl,&local_3c38);
    } while (**(int **)(puVar7 + 0x32) != **(int **)(puVar7 + 0x34));
  }
  return;
}

Assistant:

void uv__io_poll(uv_loop_t* loop, int timeout) {
  uv__loop_internal_fields_t* lfields;
  struct epoll_event events[1024];
  struct epoll_event prep[256];
  struct uv__invalidate inv;
  struct epoll_event* pe;
  struct epoll_event e;
  struct uv__iou* ctl;
  struct uv__iou* iou;
  int real_timeout;
  struct uv__queue* q;
  uv__io_t* w;
  sigset_t* sigmask;
  sigset_t sigset;
  uint64_t base;
  int have_iou_events;
  int have_signals;
  int nevents;
  int epollfd;
  int count;
  int nfds;
  int fd;
  int op;
  int i;
  int user_timeout;
  int reset_timeout;

  lfields = uv__get_internal_fields(loop);
  ctl = &lfields->ctl;
  iou = &lfields->iou;

  sigmask = NULL;
  if (loop->flags & UV_LOOP_BLOCK_SIGPROF) {
    sigemptyset(&sigset);
    sigaddset(&sigset, SIGPROF);
    sigmask = &sigset;
  }

  assert(timeout >= -1);
  base = loop->time;
  count = 48; /* Benchmarks suggest this gives the best throughput. */
  real_timeout = timeout;

  if (lfields->flags & UV_METRICS_IDLE_TIME) {
    reset_timeout = 1;
    user_timeout = timeout;
    timeout = 0;
  } else {
    reset_timeout = 0;
    user_timeout = 0;
  }

  epollfd = loop->backend_fd;

  memset(&e, 0, sizeof(e));

  while (!uv__queue_empty(&loop->watcher_queue)) {
    q = uv__queue_head(&loop->watcher_queue);
    w = uv__queue_data(q, uv__io_t, watcher_queue);
    uv__queue_remove(q);
    uv__queue_init(q);

    op = EPOLL_CTL_MOD;
    if (w->events == 0)
      op = EPOLL_CTL_ADD;

    w->events = w->pevents;
    e.events = w->pevents;
    e.data.fd = w->fd;

    uv__epoll_ctl_prep(epollfd, ctl, &prep, op, w->fd, &e);
  }

  inv.events = events;
  inv.prep = &prep;
  inv.nfds = -1;

  for (;;) {
    if (loop->nfds == 0)
      if (iou->in_flight == 0)
        break;

    /* All event mask mutations should be visible to the kernel before
     * we enter epoll_pwait().
     */
    if (ctl->ringfd != -1)
      while (*ctl->sqhead != *ctl->sqtail)
        uv__epoll_ctl_flush(epollfd, ctl, &prep);

    /* Only need to set the provider_entry_time if timeout != 0. The function
     * will return early if the loop isn't configured with UV_METRICS_IDLE_TIME.
     */
    if (timeout != 0)
      uv__metrics_set_provider_entry_time(loop);

    /* Store the current timeout in a location that's globally accessible so
     * other locations like uv__work_done() can determine whether the queue
     * of events in the callback were waiting when poll was called.
     */
    lfields->current_timeout = timeout;

    nfds = epoll_pwait(epollfd, events, ARRAY_SIZE(events), timeout, sigmask);

    /* Update loop->time unconditionally. It's tempting to skip the update when
     * timeout == 0 (i.e. non-blocking poll) but there is no guarantee that the
     * operating system didn't reschedule our process while in the syscall.
     */
    SAVE_ERRNO(uv__update_time(loop));

    if (nfds == 0) {
      assert(timeout != -1);

      if (reset_timeout != 0) {
        timeout = user_timeout;
        reset_timeout = 0;
      }

      if (timeout == -1)
        continue;

      if (timeout == 0)
        break;

      /* We may have been inside the system call for longer than |timeout|
       * milliseconds so we need to update the timestamp to avoid drift.
       */
      goto update_timeout;
    }

    if (nfds == -1) {
      if (errno != EINTR)
        abort();

      if (reset_timeout != 0) {
        timeout = user_timeout;
        reset_timeout = 0;
      }

      if (timeout == -1)
        continue;

      if (timeout == 0)
        break;

      /* Interrupted by a signal. Update timeout and poll again. */
      goto update_timeout;
    }

    have_iou_events = 0;
    have_signals = 0;
    nevents = 0;

    inv.nfds = nfds;
    lfields->inv = &inv;

    for (i = 0; i < nfds; i++) {
      pe = events + i;
      fd = pe->data.fd;

      /* Skip invalidated events, see uv__platform_invalidate_fd */
      if (fd == -1)
        continue;

      if (fd == iou->ringfd) {
        uv__poll_io_uring(loop, iou);
        have_iou_events = 1;
        continue;
      }

      assert(fd >= 0);
      assert((unsigned) fd < loop->nwatchers);

      w = loop->watchers[fd];

      if (w == NULL) {
        /* File descriptor that we've stopped watching, disarm it.
         *
         * Ignore all errors because we may be racing with another thread
         * when the file descriptor is closed.
         */
        uv__epoll_ctl_prep(epollfd, ctl, &prep, EPOLL_CTL_DEL, fd, pe);
        continue;
      }

      /* Give users only events they're interested in. Prevents spurious
       * callbacks when previous callback invocation in this loop has stopped
       * the current watcher. Also, filters out events that users has not
       * requested us to watch.
       */
      pe->events &= w->pevents | POLLERR | POLLHUP;

      /* Work around an epoll quirk where it sometimes reports just the
       * EPOLLERR or EPOLLHUP event.  In order to force the event loop to
       * move forward, we merge in the read/write events that the watcher
       * is interested in; uv__read() and uv__write() will then deal with
       * the error or hangup in the usual fashion.
       *
       * Note to self: happens when epoll reports EPOLLIN|EPOLLHUP, the user
       * reads the available data, calls uv_read_stop(), then sometime later
       * calls uv_read_start() again.  By then, libuv has forgotten about the
       * hangup and the kernel won't report EPOLLIN again because there's
       * nothing left to read.  If anything, libuv is to blame here.  The
       * current hack is just a quick bandaid; to properly fix it, libuv
       * needs to remember the error/hangup event.  We should get that for
       * free when we switch over to edge-triggered I/O.
       */
      if (pe->events == POLLERR || pe->events == POLLHUP)
        pe->events |=
          w->pevents & (POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI);

      if (pe->events != 0) {
        /* Run signal watchers last.  This also affects child process watchers
         * because those are implemented in terms of signal watchers.
         */
        if (w == &loop->signal_io_watcher) {
          have_signals = 1;
        } else {
          uv__metrics_update_idle_time(loop);
          w->cb(loop, w, pe->events);
        }

        nevents++;
      }
    }

    uv__metrics_inc_events(loop, nevents);
    if (reset_timeout != 0) {
      timeout = user_timeout;
      reset_timeout = 0;
      uv__metrics_inc_events_waiting(loop, nevents);
    }

    if (have_signals != 0) {
      uv__metrics_update_idle_time(loop);
      loop->signal_io_watcher.cb(loop, &loop->signal_io_watcher, POLLIN);
    }

    lfields->inv = NULL;

    if (have_iou_events != 0)
      break;  /* Event loop should cycle now so don't poll again. */

    if (have_signals != 0)
      break;  /* Event loop should cycle now so don't poll again. */

    if (nevents != 0) {
      if (nfds == ARRAY_SIZE(events) && --count != 0) {
        /* Poll for more events but don't block this time. */
        timeout = 0;
        continue;
      }
      break;
    }

    if (timeout == 0)
      break;

    if (timeout == -1)
      continue;

update_timeout:
    assert(timeout > 0);

    real_timeout -= (loop->time - base);
    if (real_timeout <= 0)
      break;

    timeout = real_timeout;
  }

  if (ctl->ringfd != -1)
    while (*ctl->sqhead != *ctl->sqtail)
      uv__epoll_ctl_flush(epollfd, ctl, &prep);
}